

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O2

int G1_to_bin(uint8_t *s,G1 *P,ATE_CTX *ctx)

{
  G1 tmp;
  
  G1_copy(&tmp,P);
  G1_makeaffine(&tmp,ctx);
  fp_to_bin(s,tmp.m_x,ctx);
  fp_to_bin(s + 0x20,tmp.m_y,ctx);
  return 1;
}

Assistant:

int G1_to_bin(uint8_t s[2*N_BYTES], const G1 *P, const ATE_CTX *ctx)
{
    G1 tmp;
    G1_copy(&tmp, P);
    G1_makeaffine(&tmp, ctx);
    fp_to_bin(s, tmp.m_x, ctx);
    fp_to_bin(s + N_BYTES, tmp.m_y, ctx);
    return GML_OK;
}